

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.h
# Opt level: O0

result_type __thiscall MeCab::Dictionary::exactMatchSearch(Dictionary *this,char *key)

{
  size_t in_RSI;
  size_t in_RDI;
  result_type rVar1;
  DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
  *unaff_retaddr;
  result_type n;
  uint in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  key_type_conflict *in_stack_fffffffffffffff8;
  
  Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::
  exactMatchSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
            (unaff_retaddr,in_stack_fffffffffffffff8,
             (result_pair_type *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             in_RDI,in_RSI);
  rVar1._4_4_ = 0;
  rVar1.value = in_stack_fffffffffffffff0;
  rVar1.length = (size_t)in_stack_fffffffffffffff8;
  return rVar1;
}

Assistant:

result_type exactMatchSearch(const char* key) const {
    result_type n;
    da_.exactMatchSearch(key, n);
    return n;
  }